

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_sign_det_ext
              (mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,uchar *buf,
              size_t blen,mbedtls_md_type_t md_alg,_func_int_void_ptr_uchar_ptr_size_t *f_rng_blind,
              void *p_rng_blind)

{
  int iVar1;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_mpi *d_local;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = ecdsa_sign_det_restartable
                    (grp,r,s,d,buf,blen,md_alg,f_rng_blind,p_rng_blind,
                     (mbedtls_ecdsa_restart_ctx *)0x0);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_sign_det_ext( mbedtls_ecp_group *grp, mbedtls_mpi *r,
                                mbedtls_mpi *s, const mbedtls_mpi *d,
                                const unsigned char *buf, size_t blen,
                                mbedtls_md_type_t md_alg,
                                int (*f_rng_blind)(void *, unsigned char *,
                                                   size_t),
                                void *p_rng_blind )
{
    ECDSA_VALIDATE_RET( grp   != NULL );
    ECDSA_VALIDATE_RET( r     != NULL );
    ECDSA_VALIDATE_RET( s     != NULL );
    ECDSA_VALIDATE_RET( d     != NULL );
    ECDSA_VALIDATE_RET( buf   != NULL || blen == 0 );
    ECDSA_VALIDATE_RET( f_rng_blind != NULL );

    return( ecdsa_sign_det_restartable( grp, r, s, d, buf, blen, md_alg,
                                        f_rng_blind, p_rng_blind, NULL ) );
}